

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retrieval.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  const_iterator __position;
  bool bVar1;
  int iVar2;
  common_log *pcVar3;
  size_type sVar4;
  undefined8 uVar5;
  reference pvVar6;
  reference pvVar7;
  uint *puVar8;
  llama_batch *batch_00;
  reference pvVar9;
  int i_3;
  float sim;
  int i_2;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> similarities;
  vector<float,_std::allocator<float>_> query_emb;
  vector<int,_std::allocator<int>_> query_tokens;
  string query;
  llama_batch query_batch;
  int i_1;
  float *out;
  float *out_1;
  uint64_t n_toks;
  vector<int,_std::allocator<int>_> *inp_1;
  int k;
  int s;
  int p;
  float *emb;
  vector<float,_std::allocator<float>_> embeddings;
  int n_embd;
  llama_batch batch;
  int n_chunks;
  int j;
  int i;
  vector<int,_std::allocator<int>_> inp;
  chunk *chunk;
  iterator __end1_2;
  iterator __begin1_2;
  vector<chunk,_std::allocator<chunk>_> *__range1_2;
  uint64_t n_batch;
  llama_pooling_type pooling_type;
  int n_ctx;
  int n_ctx_train;
  llama_vocab *vocab;
  llama_context *ctx;
  llama_model *model;
  common_init_result llama_init;
  vector<chunk,_std::allocator<chunk>_> file_chunk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *context_file_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<chunk,_std::allocator<chunk>_> chunks;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *context_file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  common_params params;
  common_log *in_stack_ffffffffffffe7d8;
  common_params *in_stack_ffffffffffffe7e0;
  common_log *in_stack_ffffffffffffe7e8;
  common_log *in_stack_ffffffffffffe7f0;
  common_log *in_stack_ffffffffffffe7f8;
  undefined4 in_stack_ffffffffffffe800;
  int in_stack_ffffffffffffe804;
  llama_context *in_stack_ffffffffffffe808;
  float *in_stack_ffffffffffffe810;
  common_log *in_stack_ffffffffffffe818;
  vector<chunk,_std::allocator<chunk>_> *in_stack_ffffffffffffe820;
  __normal_iterator<chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_> in_stack_ffffffffffffe828;
  __normal_iterator<chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_> in_stack_ffffffffffffe830;
  undefined4 in_stack_ffffffffffffe838;
  undefined4 in_stack_ffffffffffffe83c;
  pointer in_stack_ffffffffffffe840;
  llama_seq_id seq_id;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe848;
  llama_batch *in_stack_ffffffffffffe850;
  float *in_stack_ffffffffffffe868;
  float *in_stack_ffffffffffffe870;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe878;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe880;
  llama_context *ctx_00;
  uint uVar10;
  int local_167c;
  int local_1678;
  pair<int,_float> *local_1670;
  pair<int,_float> *local_1668;
  pair<int,_float> local_1660;
  undefined4 in_stack_ffffffffffffe9a8;
  undefined4 in_stack_ffffffffffffe9ac;
  int iVar11;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> local_1650;
  undefined4 local_1634;
  common_params *in_stack_ffffffffffffea00;
  llama_batch local_15e0;
  float local_15a1 [7];
  int local_1584;
  float *local_1580;
  float *local_1578;
  size_type local_1570;
  vector<int,_std::allocator<int>_> *local_1568;
  int local_155c;
  int local_1558;
  int local_1554;
  float *local_1550;
  llama_context local_1545;
  undefined4 local_1544;
  int local_1524;
  llama_batch local_1520;
  int local_14e4;
  string local_14e0 [36];
  int local_14bc;
  uint local_14b8;
  undefined4 local_14b4;
  vector<int,_std::allocator<int>_> local_14b0;
  reference local_1498;
  chunk *local_1490;
  __normal_iterator<chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_> local_1488;
  vector<chunk,_std::allocator<chunk>_> *local_1480;
  ulong local_1478;
  string local_1470 [36];
  int local_144c;
  uint local_1448;
  uint local_1444;
  undefined8 local_1440;
  pointer local_1438;
  pointer local_1430;
  chunk *local_1400;
  chunk *local_13f8;
  chunk *local_13f0;
  chunk *local_13e8;
  reference local_13c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_13b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_13b0;
  undefined1 *local_13a8;
  vector<chunk,_std::allocator<chunk>_> local_13a0;
  reference local_1388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1380;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1378;
  undefined1 *local_1370;
  int local_1368;
  int local_1354;
  int local_1350;
  int local_134c;
  common_params *in_stack_ffffffffffffecb8;
  string *in_stack_ffffffffffffefd8;
  int in_stack_ffffffffffffefe4;
  string *in_stack_ffffffffffffefe8;
  undefined4 local_ca8;
  uint local_c88 [510];
  _func_void_int_char_ptr_ptr *in_stack_fffffffffffffb70;
  llama_example in_stack_fffffffffffffb7c;
  common_params *in_stack_fffffffffffffb80;
  char **in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb90;
  byte local_32c;
  undefined1 auStack_e0 [24];
  int local_c8;
  int local_4;
  
  local_4 = 0;
  common_params::common_params(in_stack_ffffffffffffea00);
  bVar1 = common_params_parse(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                              in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,
                              in_stack_fffffffffffffb70);
  if (bVar1) {
    common_init();
    local_134c = local_1350;
    if (local_c8 < 1) {
      if (-1 < common_log_verbosity_thold) {
        pcVar3 = common_log_main();
        common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,"chunk_size must be positive\n");
      }
      local_4 = 1;
      local_1368 = 1;
    }
    else {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffe7f0);
      if (bVar1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar3 = common_log_main();
          common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,"context_files must be specified\n");
        }
        local_4 = 1;
        local_1368 = 1;
      }
      else {
        if (-1 < common_log_verbosity_thold) {
          pcVar3 = common_log_main();
          common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,"processing files:\n");
        }
        local_1370 = auStack_e0;
        local_1378._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffe7d8);
        local_1380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffe7d8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffe7e0,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffe7d8), bVar1) {
          local_1388 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_1378);
          if (-1 < common_log_verbosity_thold) {
            pcVar3 = common_log_main();
            uVar5 = std::__cxx11::string::c_str();
            common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,"%s\n",uVar5);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_1378);
        }
        std::vector<chunk,_std::allocator<chunk>_>::vector
                  ((vector<chunk,_std::allocator<chunk>_> *)0x1783d2);
        local_13a8 = auStack_e0;
        local_13b0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffe7d8);
        local_13b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_ffffffffffffe7d8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffe7e0,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_ffffffffffffe7d8), bVar1) {
          local_13c0 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_13b0);
          chunk_file(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe4,in_stack_ffffffffffffefd8);
          local_13e8 = (chunk *)std::vector<chunk,_std::allocator<chunk>_>::end
                                          ((vector<chunk,_std::allocator<chunk>_> *)
                                           in_stack_ffffffffffffe7d8);
          __gnu_cxx::__normal_iterator<chunk_const*,std::vector<chunk,std::allocator<chunk>>>::
          __normal_iterator<chunk*>
                    ((__normal_iterator<const_chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_>
                      *)in_stack_ffffffffffffe7e0,
                     (__normal_iterator<chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_> *)
                     in_stack_ffffffffffffe7d8);
          local_13f0 = (chunk *)std::vector<chunk,_std::allocator<chunk>_>::begin
                                          ((vector<chunk,_std::allocator<chunk>_> *)
                                           in_stack_ffffffffffffe7d8);
          local_13f8 = (chunk *)std::vector<chunk,_std::allocator<chunk>_>::end
                                          ((vector<chunk,_std::allocator<chunk>_> *)
                                           in_stack_ffffffffffffe7d8);
          __position._M_current._4_4_ = in_stack_ffffffffffffe83c;
          __position._M_current._0_4_ = in_stack_ffffffffffffe838;
          local_1400 = (chunk *)std::vector<chunk,std::allocator<chunk>>::
                                insert<__gnu_cxx::__normal_iterator<chunk*,std::vector<chunk,std::allocator<chunk>>>,void>
                                          (in_stack_ffffffffffffe820,__position,
                                           in_stack_ffffffffffffe830,in_stack_ffffffffffffe828);
          std::vector<chunk,_std::allocator<chunk>_>::~vector
                    ((vector<chunk,_std::allocator<chunk>_> *)in_stack_ffffffffffffe7f0);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_13b0);
        }
        if (-1 < common_log_verbosity_thold) {
          pcVar3 = common_log_main();
          sVar4 = std::vector<chunk,_std::allocator<chunk>_>::size(&local_13a0);
          common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,"Number of chunks: %zu\n",sVar4);
        }
        llama_backend_init();
        llama_numa_init(local_ca8);
        common_init_from_params(in_stack_ffffffffffffecb8);
        local_1430 = std::unique_ptr<llama_model,_llama_model_deleter>::get
                               ((unique_ptr<llama_model,_llama_model_deleter> *)
                                in_stack_ffffffffffffe7e0);
        local_1438 = std::unique_ptr<llama_context,_llama_context_deleter>::get
                               ((unique_ptr<llama_context,_llama_context_deleter> *)
                                in_stack_ffffffffffffe7e0);
        if (local_1430 == (pointer)0x0) {
          if (-1 < common_log_verbosity_thold) {
            pcVar3 = common_log_main();
            common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,"%s: unable to load model\n","main");
          }
          local_4 = 1;
          local_1368 = 1;
        }
        else {
          local_1440 = llama_model_get_vocab(local_1430);
          local_1444 = llama_model_n_ctx_train(local_1430);
          local_1448 = llama_n_ctx(local_1438);
          local_144c = llama_pooling_type(local_1438);
          if (local_144c != 0) {
            if (((int)local_1444 < (int)local_1448) && (-1 < common_log_verbosity_thold)) {
              pcVar3 = common_log_main();
              common_log_add(pcVar3,GGML_LOG_LEVEL_WARN,
                             "%s: warning: model was trained on only %d context tokens (%d specified)\n"
                             ,"main",(ulong)local_1444,(ulong)local_1448);
            }
            if (-1 < common_log_verbosity_thold) {
              pcVar3 = common_log_main();
              common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,"\n");
            }
            if (-1 < common_log_verbosity_thold) {
              pcVar3 = common_log_main();
              common_params_get_system_info_abi_cxx11_
                        ((common_params *)
                         CONCAT44(in_stack_ffffffffffffe9ac,in_stack_ffffffffffffe9a8));
              uVar5 = std::__cxx11::string::c_str();
              common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,"%s\n",uVar5);
              std::__cxx11::string::~string(local_1470);
            }
            local_1478 = (ulong)local_1350;
            if (local_1350 < local_1354) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/retrieval/retrieval.cpp"
                         ,0xba,"GGML_ASSERT(%s) failed","params.n_batch >= params.n_ctx");
            }
            local_1480 = &local_13a0;
            local_1488._M_current =
                 (chunk *)std::vector<chunk,_std::allocator<chunk>_>::begin
                                    ((vector<chunk,_std::allocator<chunk>_> *)
                                     in_stack_ffffffffffffe7d8);
            local_1490 = (chunk *)std::vector<chunk,_std::allocator<chunk>_>::end
                                            ((vector<chunk,_std::allocator<chunk>_> *)
                                             in_stack_ffffffffffffe7d8);
            do {
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_>
                                  *)in_stack_ffffffffffffe7e0,
                                 (__normal_iterator<chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_>
                                  *)in_stack_ffffffffffffe7d8);
              if (!bVar1) {
                if ((local_32c & 1) != 0) {
                  for (local_14b8 = 0; uVar10 = local_14b8,
                      sVar4 = std::vector<chunk,_std::allocator<chunk>_>::size(&local_13a0),
                      (int)uVar10 < (int)sVar4; local_14b8 = local_14b8 + 1) {
                    if (-1 < common_log_verbosity_thold) {
                      pcVar3 = common_log_main();
                      uVar10 = local_14b8;
                      std::vector<chunk,_std::allocator<chunk>_>::operator[]
                                (&local_13a0,(long)(int)local_14b8);
                      uVar5 = std::__cxx11::string::c_str();
                      common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,"%s: prompt %d: \'%s\'\n","main",
                                     (ulong)uVar10,uVar5);
                    }
                    if (-1 < common_log_verbosity_thold) {
                      pcVar3 = common_log_main();
                      pvVar7 = std::vector<chunk,_std::allocator<chunk>_>::operator[]
                                         (&local_13a0,(long)(int)local_14b8);
                      sVar4 = std::vector<int,_std::allocator<int>_>::size(&pvVar7->tokens);
                      common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,
                                     "%s: number of tokens in prompt = %zu\n","main",sVar4);
                    }
                    local_14bc = 0;
                    while( true ) {
                      iVar11 = local_14bc;
                      pvVar7 = std::vector<chunk,_std::allocator<chunk>_>::operator[]
                                         (&local_13a0,(long)(int)local_14b8);
                      sVar4 = std::vector<int,_std::allocator<int>_>::size(&pvVar7->tokens);
                      if ((int)sVar4 <= iVar11) break;
                      if (-1 < common_log_verbosity_thold) {
                        pcVar3 = common_log_main();
                        pvVar7 = std::vector<chunk,_std::allocator<chunk>_>::operator[]
                                           (&local_13a0,(long)(int)local_14b8);
                        puVar8 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                                   (&pvVar7->tokens,(long)local_14bc);
                        uVar10 = *puVar8;
                        pvVar7 = std::vector<chunk,_std::allocator<chunk>_>::operator[]
                                           (&local_13a0,(long)(int)local_14b8);
                        std::vector<int,_std::allocator<int>_>::operator[]
                                  (&pvVar7->tokens,(long)local_14bc);
                        common_token_to_piece_abi_cxx11_
                                  ((llama_context *)in_stack_ffffffffffffe7f8,
                                   (llama_token)((ulong)in_stack_ffffffffffffe7f0 >> 0x20),
                                   SUB81((ulong)in_stack_ffffffffffffe7f0 >> 0x18,0));
                        uVar5 = std::__cxx11::string::c_str();
                        common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,"%6d -> \'%s\'\n",(ulong)uVar10,
                                       uVar5);
                        std::__cxx11::string::~string(local_14e0);
                      }
                      local_14bc = local_14bc + 1;
                    }
                    if (-1 < common_log_verbosity_thold) {
                      pcVar3 = common_log_main();
                      common_log_add(pcVar3,GGML_LOG_LEVEL_INFO,"\n\n");
                    }
                  }
                }
                sVar4 = std::vector<chunk,_std::allocator<chunk>_>::size(&local_13a0);
                local_14e4 = (int)sVar4;
                llama_batch_init(&local_1520,local_1478 & 0xffffffff,0,1);
                local_1524 = llama_model_n_embd(local_1430);
                batch_00 = (llama_batch *)(long)(local_14e4 * local_1524);
                local_1544 = 0;
                ctx_00 = &local_1545;
                std::allocator<float>::allocator((allocator<float> *)0x178f27);
                std::vector<float,_std::allocator<float>_>::vector
                          ((vector<float,_std::allocator<float>_> *)
                           CONCAT44(in_stack_ffffffffffffe804,in_stack_ffffffffffffe800),
                           (size_type)in_stack_ffffffffffffe7f8,
                           (value_type_conflict2 *)in_stack_ffffffffffffe7f0,
                           (allocator_type *)in_stack_ffffffffffffe7e8);
                std::allocator<float>::~allocator((allocator<float> *)0x178f5b);
                local_1550 = std::vector<float,_std::allocator<float>_>::data
                                       ((vector<float,_std::allocator<float>_> *)0x178f68);
                local_1554 = 0;
                local_1558 = 0;
                for (local_155c = 0; local_155c < local_14e4; local_155c = local_155c + 1) {
                  pvVar7 = std::vector<chunk,_std::allocator<chunk>_>::operator[]
                                     (&local_13a0,(long)local_155c);
                  local_1568 = &pvVar7->tokens;
                  local_1570 = std::vector<int,_std::allocator<int>_>::size(local_1568);
                  if (local_1478 < (long)local_1520.n_tokens + local_1570) {
                    local_1578 = local_1550 + local_1554 * local_1524;
                    batch_decode(ctx_00,batch_00,in_stack_ffffffffffffe870,
                                 (int)((ulong)in_stack_ffffffffffffe868 >> 0x20),
                                 (int)in_stack_ffffffffffffe868);
                    common_batch_clear(&local_1520);
                    local_1554 = local_1558 + local_1554;
                    local_1558 = 0;
                  }
                  batch_add_seq(in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,
                                (llama_seq_id)((ulong)in_stack_ffffffffffffe840 >> 0x20));
                  local_1558 = local_1558 + 1;
                }
                local_1580 = local_1550 + local_1554 * local_1524;
                batch_decode(ctx_00,batch_00,in_stack_ffffffffffffe870,
                             (int)((ulong)in_stack_ffffffffffffe868 >> 0x20),
                             (int)in_stack_ffffffffffffe868);
                for (local_1584 = 0; local_1584 < local_14e4; local_1584 = local_1584 + 1) {
                  in_stack_ffffffffffffe868 = local_1550 + (local_1584 + 1) * local_1524;
                  in_stack_ffffffffffffe870 = local_15a1;
                  std::allocator<float>::allocator((allocator<float> *)0x1791cc);
                  std::vector<float,std::allocator<float>>::vector<float*,void>
                            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe820,
                             (float *)in_stack_ffffffffffffe818,in_stack_ffffffffffffe810,
                             (allocator_type *)in_stack_ffffffffffffe808);
                  std::vector<chunk,_std::allocator<chunk>_>::operator[]
                            (&local_13a0,(long)local_1584);
                  std::vector<float,_std::allocator<float>_>::operator=
                            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe7f0,
                             (vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe7e8);
                  std::vector<float,_std::allocator<float>_>::~vector
                            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe7f0);
                  std::allocator<float>::~allocator((allocator<float> *)0x179236);
                  std::vector<chunk,_std::allocator<chunk>_>::operator[]
                            (&local_13a0,(long)local_1584);
                  std::vector<int,_std::allocator<int>_>::clear
                            ((vector<int,_std::allocator<int>_> *)0x179257);
                }
                llama_batch_init(&local_15e0,local_1478 & 0xffffffff,0,1);
                std::__cxx11::string::string((string *)&stack0xffffffffffffea00);
                do {
                  seq_id = (llama_seq_id)((ulong)in_stack_ffffffffffffe840 >> 0x20);
                  if (-1 < common_log_verbosity_thold) {
                    pcVar3 = common_log_main();
                    common_log_add(pcVar3,GGML_LOG_LEVEL_NONE,"Enter query: ");
                  }
                  std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&std::cin,(string *)&stack0xffffffffffffea00);
                  common_tokenize(in_stack_ffffffffffffe808,
                                  (string *)
                                  CONCAT44(in_stack_ffffffffffffe804,in_stack_ffffffffffffe800),
                                  SUB81((ulong)in_stack_ffffffffffffe7f8 >> 0x38,0),
                                  SUB81((ulong)in_stack_ffffffffffffe7f8 >> 0x30,0));
                  batch_add_seq(in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,seq_id);
                  in_stack_ffffffffffffe848 = (vector<int,_std::allocator<int>_> *)(long)local_1524;
                  local_1634 = 0;
                  in_stack_ffffffffffffe850 = (llama_batch *)&stack0xffffffffffffe9cb;
                  std::allocator<float>::allocator((allocator<float> *)0x179397);
                  std::vector<float,_std::allocator<float>_>::vector
                            ((vector<float,_std::allocator<float>_> *)
                             CONCAT44(in_stack_ffffffffffffe804,in_stack_ffffffffffffe800),
                             (size_type)in_stack_ffffffffffffe7f8,
                             (value_type_conflict2 *)in_stack_ffffffffffffe7f0,
                             (allocator_type *)in_stack_ffffffffffffe7e8);
                  std::allocator<float>::~allocator((allocator<float> *)0x1793c5);
                  in_stack_ffffffffffffe840 = local_1438;
                  std::vector<float,_std::allocator<float>_>::data
                            ((vector<float,_std::allocator<float>_> *)0x1793df);
                  batch_decode(ctx_00,batch_00,in_stack_ffffffffffffe870,
                               (int)((ulong)in_stack_ffffffffffffe868 >> 0x20),
                               (int)in_stack_ffffffffffffe868);
                  common_batch_clear(&local_15e0);
                  std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  vector((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)
                         0x17941f);
                  for (iVar11 = 0; iVar11 < local_14e4; iVar11 = iVar11 + 1) {
                    std::vector<chunk,_std::allocator<chunk>_>::operator[](&local_13a0,(long)iVar11)
                    ;
                    std::vector<float,_std::allocator<float>_>::data
                              ((vector<float,_std::allocator<float>_> *)0x17945f);
                    std::vector<float,_std::allocator<float>_>::data
                              ((vector<float,_std::allocator<float>_> *)0x179471);
                    common_embd_similarity_cos
                              ((float *)in_stack_ffffffffffffe818,in_stack_ffffffffffffe810,
                               (int)((ulong)in_stack_ffffffffffffe808 >> 0x20));
                    local_1660 = std::make_pair<int&,float&>
                                           ((int *)in_stack_ffffffffffffe7d8,(float *)0x1794b1);
                    std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                    push_back((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               *)in_stack_ffffffffffffe7e0,(value_type *)in_stack_ffffffffffffe7d8);
                  }
                  local_1668 = (pair<int,_float> *)
                               std::
                               vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               ::begin((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                        *)in_stack_ffffffffffffe7d8);
                  local_1670 = (pair<int,_float> *)
                               std::
                               vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               ::end((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                                      *)in_stack_ffffffffffffe7d8);
                  std::
                  sort<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,main::__0>
                            (local_1668,local_1670);
                  if (-1 < common_log_verbosity_thold) {
                    in_stack_ffffffffffffe818 = common_log_main();
                    common_log_add(in_stack_ffffffffffffe818,GGML_LOG_LEVEL_NONE,
                                   "Top %d similar chunks:\n",(ulong)local_c88[0]);
                  }
                  local_1678 = 0;
                  while( true ) {
                    in_stack_ffffffffffffe808 = (llama_context *)local_c88;
                    in_stack_ffffffffffffe804 = local_1678;
                    sVar4 = std::vector<chunk,_std::allocator<chunk>_>::size(&local_13a0);
                    local_167c = (int)sVar4;
                    in_stack_ffffffffffffe810 =
                         (float *)std::min<int>((int *)in_stack_ffffffffffffe808,&local_167c);
                    if ((int)*in_stack_ffffffffffffe810 <= in_stack_ffffffffffffe804) break;
                    if (-1 < common_log_verbosity_thold) {
                      in_stack_ffffffffffffe7f8 = common_log_main();
                      pvVar9 = std::
                               vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               ::operator[](&local_1650,(long)local_1678);
                      std::vector<chunk,_std::allocator<chunk>_>::operator[]
                                (&local_13a0,(long)pvVar9->first);
                      uVar5 = std::__cxx11::string::c_str();
                      common_log_add(in_stack_ffffffffffffe7f8,GGML_LOG_LEVEL_NONE,"filename: %s\n",
                                     uVar5);
                    }
                    if (-1 < common_log_verbosity_thold) {
                      in_stack_ffffffffffffe7f0 = common_log_main();
                      pvVar9 = std::
                               vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               ::operator[](&local_1650,(long)local_1678);
                      pvVar7 = std::vector<chunk,_std::allocator<chunk>_>::operator[]
                                         (&local_13a0,(long)pvVar9->first);
                      common_log_add(in_stack_ffffffffffffe7f0,GGML_LOG_LEVEL_NONE,"filepos: %lld\n"
                                     ,pvVar7->filepos);
                    }
                    if (-1 < common_log_verbosity_thold) {
                      in_stack_ffffffffffffe7e8 = common_log_main();
                      pvVar9 = std::
                               vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               ::operator[](&local_1650,(long)local_1678);
                      common_log_add((common_log *)(double)pvVar9->second,
                                     (ggml_log_level)in_stack_ffffffffffffe7e8,(char *)0x0,
                                     "similarity: %f\n");
                    }
                    if (-1 < common_log_verbosity_thold) {
                      in_stack_ffffffffffffe7e0 = (common_params *)common_log_main();
                      pvVar9 = std::
                               vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>
                               ::operator[](&local_1650,(long)local_1678);
                      std::vector<chunk,_std::allocator<chunk>_>::operator[]
                                (&local_13a0,(long)pvVar9->first);
                      uVar5 = std::__cxx11::string::c_str();
                      common_log_add((common_log *)in_stack_ffffffffffffe7e0,GGML_LOG_LEVEL_NONE,
                                     "textdata:\n%s\n",uVar5);
                    }
                    if (-1 < common_log_verbosity_thold) {
                      in_stack_ffffffffffffe7d8 = common_log_main();
                      common_log_add(in_stack_ffffffffffffe7d8,GGML_LOG_LEVEL_NONE,
                                     "--------------------\n");
                    }
                    local_1678 = local_1678 + 1;
                  }
                  std::vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
                  ~vector((vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)
                          in_stack_ffffffffffffe7f0);
                  std::vector<float,_std::allocator<float>_>::~vector
                            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffe7f0);
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7f0);
                } while( true );
              }
              local_1498 = __gnu_cxx::
                           __normal_iterator<chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_>::
                           operator*(&local_1488);
              common_tokenize(in_stack_ffffffffffffe808,
                              (string *)
                              CONCAT44(in_stack_ffffffffffffe804,in_stack_ffffffffffffe800),
                              SUB81((ulong)in_stack_ffffffffffffe7f8 >> 0x38,0),
                              SUB81((ulong)in_stack_ffffffffffffe7f8 >> 0x30,0));
              sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_14b0);
              if (local_1478 < sVar4) {
                if (-1 < common_log_verbosity_thold) {
                  pcVar3 = common_log_main();
                  sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_14b0);
                  common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,
                                 "%s: chunk size (%lld) exceeds batch size (%lld), increase batch size and re-run\n"
                                 ,"main",sVar4,local_1478);
                }
                local_4 = 1;
                local_1368 = 1;
              }
              else {
                iVar11 = llama_vocab_eos(local_1440);
                if (-1 < iVar11) {
                  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7f0)
                  ;
                  if (!bVar1) {
                    pvVar6 = std::vector<int,_std::allocator<int>_>::back
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_ffffffffffffe7e0);
                    iVar11 = *pvVar6;
                    iVar2 = llama_vocab_eos(local_1440);
                    if (iVar11 == iVar2) goto LAB_00178b31;
                  }
                  local_14b4 = llama_vocab_eos(local_1440);
                  std::vector<int,_std::allocator<int>_>::push_back
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7e0,
                             (value_type_conflict1 *)in_stack_ffffffffffffe7d8);
                }
LAB_00178b31:
                std::vector<int,_std::allocator<int>_>::operator=
                          (in_stack_ffffffffffffe880,in_stack_ffffffffffffe878);
                local_1368 = 0;
              }
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe7f0);
              if (local_1368 != 0) goto LAB_00179895;
              __gnu_cxx::__normal_iterator<chunk_*,_std::vector<chunk,_std::allocator<chunk>_>_>::
              operator++(&local_1488);
            } while( true );
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar3 = common_log_main();
            common_log_add(pcVar3,GGML_LOG_LEVEL_ERROR,"%s: pooling type NONE not supported\n",
                           "main");
          }
          local_4 = 1;
          local_1368 = 1;
        }
LAB_00179895:
        common_init_result::~common_init_result((common_init_result *)in_stack_ffffffffffffe7e0);
        std::vector<chunk,_std::allocator<chunk>_>::~vector
                  ((vector<chunk,_std::allocator<chunk>_> *)in_stack_ffffffffffffe7f0);
      }
    }
  }
  else {
    local_4 = 1;
    local_1368 = 1;
  }
  common_params::~common_params(in_stack_ffffffffffffe7e0);
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_RETRIEVAL, print_usage)) {
        return 1;
    }

    common_init();

    // For BERT models, batch size must be equal to ubatch size
    params.n_ubatch = params.n_batch;
    params.embedding = true;

    if (params.chunk_size <= 0) {
        LOG_ERR("chunk_size must be positive\n");
        return 1;
    }
    if (params.context_files.empty()) {
        LOG_ERR("context_files must be specified\n");
        return 1;
    }

    LOG_INF("processing files:\n");
    for (auto & context_file : params.context_files) {
        LOG_INF("%s\n", context_file.c_str());
    }

    std::vector<chunk> chunks;
    for (auto & context_file : params.context_files) {
        std::vector<chunk> file_chunk = chunk_file(context_file, params.chunk_size, params.chunk_separator);
        chunks.insert(chunks.end(), file_chunk.begin(), file_chunk.end());
    }
    LOG_INF("Number of chunks: %zu\n", chunks.size());

    llama_backend_init();
    llama_numa_init(params.numa);

    // load the model
    common_init_result llama_init = common_init_from_params(params);

    llama_model * model = llama_init.model.get();
    llama_context * ctx = llama_init.context.get();

    if (model == NULL) {
        LOG_ERR("%s: unable to load model\n", __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    const int n_ctx_train = llama_model_n_ctx_train(model);
    const int n_ctx = llama_n_ctx(ctx);

    const enum llama_pooling_type pooling_type = llama_pooling_type(ctx);
    if (pooling_type == LLAMA_POOLING_TYPE_NONE) {
        LOG_ERR("%s: pooling type NONE not supported\n", __func__);
        return 1;
    }

    if (n_ctx > n_ctx_train) {
        LOG_WRN("%s: warning: model was trained on only %d context tokens (%d specified)\n",
                __func__, n_ctx_train, n_ctx);
    }

    // print system information
    {
        LOG_INF("\n");
        LOG_INF("%s\n", common_params_get_system_info(params).c_str());
    }

    // max batch size
    const uint64_t n_batch = params.n_batch;
    GGML_ASSERT(params.n_batch >= params.n_ctx);

    // tokenize the prompts and trim
    for (auto & chunk : chunks) {
        auto inp = common_tokenize(ctx, chunk.textdata, true, false);
        if (inp.size() > n_batch) {
            LOG_ERR("%s: chunk size (%lld) exceeds batch size (%lld), increase batch size and re-run\n",
                    __func__, (long long int) inp.size(), (long long int) n_batch);
            return 1;
        }
        // add eos if not present
        if (llama_vocab_eos(vocab) >= 0 && (inp.empty() || inp.back() != llama_vocab_eos(vocab))) {
            inp.push_back(llama_vocab_eos(vocab));
        }
        chunk.tokens = inp;
    }

    // tokenization stats
    if (params.verbose_prompt) {
        for (int i = 0; i < (int) chunks.size(); i++) {
            LOG_INF("%s: prompt %d: '%s'\n", __func__, i, chunks[i].textdata.c_str());
            LOG_INF("%s: number of tokens in prompt = %zu\n", __func__, chunks[i].tokens.size());
            for (int j = 0; j < (int) chunks[i].tokens.size(); j++) {
                LOG_INF("%6d -> '%s'\n", chunks[i].tokens[j], common_token_to_piece(ctx, chunks[i].tokens[j]).c_str());
            }
            LOG_INF("\n\n");
        }
    }

    // initialize batch
    const int n_chunks = chunks.size();
    struct llama_batch batch = llama_batch_init(n_batch, 0, 1);

    // allocate output
    const int n_embd = llama_model_n_embd(model);
    std::vector<float> embeddings(n_chunks * n_embd, 0);
    float * emb = embeddings.data();

    // break into batches
    int p = 0; // number of prompts processed already
    int s = 0; // number of prompts in current batch
    for (int k = 0; k < n_chunks; k++) {
        // clamp to n_batch tokens
        auto & inp = chunks[k].tokens;

        const uint64_t n_toks = inp.size();

        // encode if at capacity
        if (batch.n_tokens + n_toks > n_batch) {
            float * out = emb + p * n_embd;
            batch_decode(ctx, batch, out, s, n_embd);
            common_batch_clear(batch);
            p += s;
            s = 0;
        }

        // add to batch
        batch_add_seq(batch, inp, s);
        s += 1;
    }

    // final batch
    float * out = emb + p * n_embd;
    batch_decode(ctx, batch, out, s, n_embd);

    // save embeddings to chunks
    for (int i = 0; i < n_chunks; i++) {
        chunks[i].embedding = std::vector<float>(emb + i * n_embd, emb + (i + 1) * n_embd);
        // clear tokens as they are no longer needed
        chunks[i].tokens.clear();
    }

    struct llama_batch query_batch = llama_batch_init(n_batch, 0, 1);

    // start loop, receive query and return top k similar chunks based on cosine similarity
    std::string query;
    while (true) {
        LOG("Enter query: ");
        std::getline(std::cin, query);
        std::vector<int32_t> query_tokens = common_tokenize(ctx, query, true);

        batch_add_seq(query_batch, query_tokens, 0);

        std::vector<float> query_emb(n_embd, 0);
        batch_decode(ctx, query_batch, query_emb.data(), 1, n_embd);

        common_batch_clear(query_batch);

        // compute cosine similarities
        {
            std::vector<std::pair<int, float>> similarities;
            for (int i = 0; i < n_chunks; i++) {
                float sim = common_embd_similarity_cos(chunks[i].embedding.data(), query_emb.data(), n_embd);
                similarities.push_back(std::make_pair(i, sim));
            }

            // sort similarities
            std::sort(similarities.begin(), similarities.end(), [](const std::pair<int, float> & a, const std::pair<int, float> & b) {
                return a.second > b.second;
            });

            LOG("Top %d similar chunks:\n", params.sampling.top_k);
            for (int i = 0; i < std::min(params.sampling.top_k, (int) chunks.size()); i++) {
                LOG("filename: %s\n", chunks[similarities[i].first].filename.c_str());
                LOG("filepos: %lld\n", (long long int) chunks[similarities[i].first].filepos);
                LOG("similarity: %f\n", similarities[i].second);
                LOG("textdata:\n%s\n", chunks[similarities[i].first].textdata.c_str());
                LOG("--------------------\n");
            }
        }
    }

    LOG("\n");
    llama_perf_context_print(ctx);

    // clean up
    llama_batch_free(query_batch);
    llama_backend_free();
}